

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.cpp
# Opt level: O1

void __thiscall TTD::UtilSupport::TTAutoString::Append(TTAutoString *this,uint64 val)

{
  HeapAllocator *this_00;
  char16 *pcVar1;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if (this->m_optFormatBuff == (char16 *)0x0) {
    local_40 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x40;
    data.count = (size_t)anon_var_dwarf_447af96;
    data.filename._0_4_ = 200;
    this_00 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_40);
    pcVar1 = (char16 *)Memory::HeapAllocator::AllocT<true>(this_00,0x80);
    if (pcVar1 == (char16 *)0x0) {
      TTDAbort_unrecoverable_error("OOM in TTD");
    }
    pcVar1[0x38] = L'\0';
    pcVar1[0x39] = L'\0';
    pcVar1[0x3a] = L'\0';
    pcVar1[0x3b] = L'\0';
    pcVar1[0x3c] = L'\0';
    pcVar1[0x3d] = L'\0';
    pcVar1[0x3e] = L'\0';
    pcVar1[0x3f] = L'\0';
    pcVar1[0x30] = L'\0';
    pcVar1[0x31] = L'\0';
    pcVar1[0x32] = L'\0';
    pcVar1[0x33] = L'\0';
    pcVar1[0x34] = L'\0';
    pcVar1[0x35] = L'\0';
    pcVar1[0x36] = L'\0';
    pcVar1[0x37] = L'\0';
    pcVar1[0x28] = L'\0';
    pcVar1[0x29] = L'\0';
    pcVar1[0x2a] = L'\0';
    pcVar1[0x2b] = L'\0';
    pcVar1[0x2c] = L'\0';
    pcVar1[0x2d] = L'\0';
    pcVar1[0x2e] = L'\0';
    pcVar1[0x2f] = L'\0';
    pcVar1[0x20] = L'\0';
    pcVar1[0x21] = L'\0';
    pcVar1[0x22] = L'\0';
    pcVar1[0x23] = L'\0';
    pcVar1[0x24] = L'\0';
    pcVar1[0x25] = L'\0';
    pcVar1[0x26] = L'\0';
    pcVar1[0x27] = L'\0';
    pcVar1[0x18] = L'\0';
    pcVar1[0x19] = L'\0';
    pcVar1[0x1a] = L'\0';
    pcVar1[0x1b] = L'\0';
    pcVar1[0x1c] = L'\0';
    pcVar1[0x1d] = L'\0';
    pcVar1[0x1e] = L'\0';
    pcVar1[0x1f] = L'\0';
    pcVar1[0x10] = L'\0';
    pcVar1[0x11] = L'\0';
    pcVar1[0x12] = L'\0';
    pcVar1[0x13] = L'\0';
    pcVar1[0x14] = L'\0';
    pcVar1[0x15] = L'\0';
    pcVar1[0x16] = L'\0';
    pcVar1[0x17] = L'\0';
    pcVar1[8] = L'\0';
    pcVar1[9] = L'\0';
    pcVar1[10] = L'\0';
    pcVar1[0xb] = L'\0';
    pcVar1[0xc] = L'\0';
    pcVar1[0xd] = L'\0';
    pcVar1[0xe] = L'\0';
    pcVar1[0xf] = L'\0';
    pcVar1[0] = L'\0';
    pcVar1[1] = L'\0';
    pcVar1[2] = L'\0';
    pcVar1[3] = L'\0';
    pcVar1[4] = L'\0';
    pcVar1[5] = L'\0';
    pcVar1[6] = L'\0';
    pcVar1[7] = L'\0';
    this->m_optFormatBuff = pcVar1;
  }
  swprintf_s((char16_t_conflict *)this->m_optFormatBuff,0x20,(char16_t_conflict *)L"%I64u",val);
  Append(this,this->m_optFormatBuff,0,0xffffffffffffffff);
  return;
}

Assistant:

void TTAutoString::Append(uint64 val)
        {
            if(this->m_optFormatBuff == nullptr)
            {
                this->m_optFormatBuff = TT_HEAP_ALLOC_ARRAY_ZERO(char16, 64);
            }

            swprintf_s(this->m_optFormatBuff, 32, _u("%I64u"), val); //64 char16s is 32 words

            this->Append(this->m_optFormatBuff);
        }